

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_mouseup(_glist *x,t_floatarg fxpos,t_floatarg fypos,t_floatarg fwhich,t_floatarg fmod)

{
  undefined1 *puVar1;
  _instanceeditor *p_Var2;
  t_selection *ptVar3;
  double dVar4;
  t_editor *ptVar5;
  t_glistmotionfn p_Var6;
  int iVar7;
  int ypos;
  
  if (x->gl_editor == (t_editor *)0x0) {
    bug("editor");
    return;
  }
  iVar7 = (int)fxpos;
  ypos = (int)fypos;
  dVar4 = sys_getrealtime();
  p_Var2 = (pd_maininstance.pd_gui)->i_editor;
  *(double *)(p_Var2 + 0x48) = dVar4;
  *(ulong *)(p_Var2 + 0x50) = CONCAT44(ypos,iVar7);
  ptVar5 = x->gl_editor;
  switch(ptVar5->field_0x88 & 7) {
  case 1:
  case 6:
    ptVar3 = ptVar5->e_selection;
    if ((ptVar3 != (t_selection *)0x0) && (ptVar3->sel_next == (_selection *)0x0)) {
      iVar7 = canvas_undo_confirmdiscard(ptVar3->sel_what);
      if (iVar7 != 0) {
        return;
      }
      gobj_activate(x->gl_editor->e_selection->sel_what,x,1);
    }
    break;
  case 2:
    canvas_doconnect(x,iVar7,ypos,(int)fmod,1);
    break;
  case 3:
    canvas_doregion(x,iVar7,ypos,1);
    break;
  case 4:
    p_Var6 = ptVar5->e_motionfn;
    if (p_Var6 == (t_glistmotionfn)0x0) {
      bug("e_motionfn");
      ptVar5 = x->gl_editor;
      p_Var6 = ptVar5->e_motionfn;
    }
    (*p_Var6)(ptVar5->e_grab,(float)(iVar7 - ptVar5->e_xwas),(float)(ypos - ptVar5->e_ywas),1.0);
  }
  puVar1 = &x->gl_editor->field_0x88;
  *puVar1 = *puVar1 & 0xf8;
  return;
}

Assistant:

void canvas_mouseup(t_canvas *x,
    t_floatarg fxpos, t_floatarg fypos, t_floatarg fwhich,
    t_floatarg fmod)
{
    int xpos = fxpos, ypos = fypos, which = fwhich;
    int mod = fmod;
#if 0
    post("mouseup %d %d %d %d", xpos, ypos, which, mod);
#endif
    if (!x->gl_editor)
    {
        bug("editor");
        return;
    }

    EDITOR->canvas_upclicktime = sys_getrealtime();
    EDITOR->canvas_upx = xpos;
    EDITOR->canvas_upy = ypos;

    if (x->gl_editor->e_onmotion == MA_CONNECT)
        canvas_doconnect(x, xpos, ypos, mod, 1);
    else if (x->gl_editor->e_onmotion == MA_REGION)
        canvas_doregion(x, xpos, ypos, 1);
    else if ((x->gl_editor->e_onmotion == MA_MOVE ||
              x->gl_editor->e_onmotion == MA_RESIZE))
    {
            /* if there's only one text item selected activate the text.
            LATER consider under sme conditions not activating it, for instance
            if it appears to have been desired only to move the object.  Maybe
            shift-click could allow dragging without activating text?  A
            different solution (only activating if the object wasn't moved
            (commit f0df4e586) turned out to flout ctrlD+move+retype. */
        if (x->gl_editor->e_selection &&
            !(x->gl_editor->e_selection->sel_next))
        {
            t_gobj *g = x->gl_editor->e_selection->sel_what;
            t_glist *gl2;
                /* first though, check we aren't an abstraction with a
                   dirty sub-patch that would be discarded if we edit this. */
            if (canvas_undo_confirmdiscard(g))
                return;
                /* OK, activate it */
            gobj_activate(x->gl_editor->e_selection->sel_what, x, 1);
        }
    }
    else if (x->gl_editor->e_onmotion == MA_PASSOUT)
    {
        if (!x->gl_editor->e_motionfn)
            bug("e_motionfn");
        (*x->gl_editor->e_motionfn)(&x->gl_editor->e_grab->g_pd,
            xpos - x->gl_editor->e_xwas, ypos - x->gl_editor->e_ywas, 1);
    }
    x->gl_editor->e_onmotion = MA_NONE;
}